

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void clearkeys(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  Table *h;
  TValue *o;
  TValue *pTVar4;
  
  if (l != (GCObject *)0x0) {
    do {
      bVar1 = l->field_0xb;
      if (bVar1 != 0x1f) {
        lVar2 = *(long *)&l[1].tt;
        o = (TValue *)(lVar2 + 0x10);
        do {
          if (o[-1].tt_ == 0) {
LAB_00115f77:
            if (((o->tt_ & 0x40) != 0) && ((((o->value_).gc)->marked & 3) != 0)) {
              o->tt_ = 10;
            }
          }
          else {
            iVar3 = iscleared(g,o);
            if (iVar3 != 0) {
              o[-1].tt_ = 0;
              goto LAB_00115f77;
            }
            if (o[-1].tt_ == 0) goto LAB_00115f77;
          }
          pTVar4 = o + 1;
          o = o + 2;
        } while (pTVar4 < (TValue *)((long)(1 << (bVar1 & 0x1f)) * 0x20 + lVar2));
      }
      l = l[3].next;
    } while (l != (GCObject *)0x0);
  }
  return;
}

Assistant:

static void clearkeys (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    for (n = gnode(h, 0); n < limit; n++) {
      if (!ttisnil(gval(n)) && (iscleared(g, gkey(n)))) {
        setnilvalue(gval(n));  /* remove value ... */
      }
      if (ttisnil(gval(n)))  /* is entry empty? */
        removeentry(n);  /* remove entry from table */
    }
  }
}